

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_test.cc
# Opt level: O3

void re2::RE2PartialMatchN(void)

{
  bool bVar1;
  int iVar2;
  int i;
  Arg *args [2];
  string s;
  int local_20c;
  Arg *local_208;
  StringPiece **local_200;
  StringPiece local_1f8;
  StringPiece local_1e8;
  char local_1d8 [16];
  Arg local_1c8;
  StringPiece *local_1b8;
  code *local_1b0;
  LogMessage local_1a0;
  
  local_200 = &local_1b8;
  local_1c8.arg_ = (void *)0x0;
  local_1c8.parser_ = RE2::Arg::parse_null;
  local_1b8 = (StringPiece *)0x0;
  local_1b0 = RE2::Arg::parse_null;
  local_208 = &local_1c8;
  local_1e8.ptr_ = "hello";
  local_1e8.length_ = 5;
  RE2::RE2((RE2 *)&local_1a0,"e.*o");
  bVar1 = RE2::PartialMatchN(&local_1e8,(RE2 *)&local_1a0,&local_208,0);
  RE2::~RE2((RE2 *)&local_1a0);
  if (!bVar1) {
    LogMessage::LogMessage
              (&local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x255,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a0.str_,
               "Check failed: RE2::PartialMatchN(\"hello\", \"e.*o\", args, 0)",0x3a);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1a0);
  }
  local_1e8.ptr_ = "othello";
  local_1e8.length_ = 7;
  RE2::RE2((RE2 *)&local_1a0,"a.*o");
  bVar1 = RE2::PartialMatchN(&local_1e8,(RE2 *)&local_1a0,&local_208,0);
  RE2::~RE2((RE2 *)&local_1a0);
  if (bVar1) {
    LogMessage::LogMessage
              (&local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x256,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a0.str_,
               "Check failed: !(RE2::PartialMatchN(\"othello\", \"a.*o\", args, 0))",0x3f);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1a0);
  }
  local_1c8.arg_ = &local_20c;
  local_1c8.parser_ = RE2::Arg::parse_int;
  local_1e8.ptr_ = "1001 nights";
  local_1e8.length_ = 0xb;
  RE2::RE2((RE2 *)&local_1a0,"(\\d+)");
  bVar1 = RE2::PartialMatchN(&local_1e8,(RE2 *)&local_1a0,&local_208,1);
  RE2::~RE2((RE2 *)&local_1a0);
  if (!bVar1) {
    LogMessage::LogMessage
              (&local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x25b,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a0.str_,
               "Check failed: RE2::PartialMatchN(\"1001 nights\", \"(\\\\d+)\", args, 1)",0x42);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1a0);
  }
  if (local_20c != 0x3e9) {
    LogMessage::LogMessage
              (&local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x25c,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a0.str_,"Check failed: (1001) == (i)",0x1b);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1a0);
  }
  local_1e8.ptr_ = "three";
  local_1e8.length_ = 5;
  RE2::RE2((RE2 *)&local_1a0,"(\\d+)");
  bVar1 = RE2::PartialMatchN(&local_1e8,(RE2 *)&local_1a0,&local_208,1);
  RE2::~RE2((RE2 *)&local_1a0);
  if (bVar1) {
    LogMessage::LogMessage
              (&local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x25d,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a0.str_,
               "Check failed: !(RE2::PartialMatchN(\"three\", \"(\\\\d+)\", args, 1))",0x3f);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1a0);
  }
  local_1e8.length_ = 0;
  local_1e8._12_4_ = 0;
  local_1d8[0] = '\0';
  local_1b0 = RE2::Arg::parse_string;
  local_1f8.ptr_ = "answer: 42:life";
  local_1f8.length_ = 0xf;
  local_1e8.ptr_ = local_1d8;
  local_1b8 = &local_1e8;
  RE2::RE2((RE2 *)&local_1a0,"(\\d+):(\\w+)");
  bVar1 = RE2::PartialMatchN(&local_1f8,(RE2 *)&local_1a0,&local_208,2);
  RE2::~RE2((RE2 *)&local_1a0);
  if (!bVar1) {
    LogMessage::LogMessage
              (&local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x262,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a0.str_,
               "Check failed: RE2::PartialMatchN(\"answer: 42:life\", \"(\\\\d+):(\\\\w+)\", args, 2)"
               ,0x4d);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1a0);
  }
  if (local_20c != 0x2a) {
    LogMessage::LogMessage
              (&local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x263,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a0.str_,"Check failed: (42) == (i)",0x19);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1a0);
  }
  iVar2 = std::__cxx11::string::compare((char *)&local_1e8);
  if (iVar2 != 0) {
    LogMessage::LogMessage
              (&local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x264,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a0.str_,"Check failed: (\"life\") == (s)",0x1d);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1a0);
  }
  local_1f8.ptr_ = "hi1";
  local_1f8.length_ = 3;
  RE2::RE2((RE2 *)&local_1a0,"(\\w+)(1)");
  bVar1 = RE2::PartialMatchN(&local_1f8,(RE2 *)&local_1a0,&local_208,2);
  RE2::~RE2((RE2 *)&local_1a0);
  if (bVar1) {
    LogMessage::LogMessage
              (&local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x265,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a0.str_,
               "Check failed: !(RE2::PartialMatchN(\"hi1\", \"(\\\\w+)(1)\", args, 2))",0x40);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1a0);
  }
  if (local_1e8.ptr_ != local_1d8) {
    operator_delete(local_1e8.ptr_);
  }
  return;
}

Assistant:

TEST(RE2, PartialMatchN) {
  RE2::Arg argv[2];
  const RE2::Arg* const args[2] = { &argv[0], &argv[1] };

  // 0 arg
  EXPECT_TRUE(RE2::PartialMatchN("hello", "e.*o", args, 0));
  EXPECT_FALSE(RE2::PartialMatchN("othello", "a.*o", args, 0));

  // 1 arg
  int i;
  argv[0] = &i;
  EXPECT_TRUE(RE2::PartialMatchN("1001 nights", "(\\d+)", args, 1));
  EXPECT_EQ(1001, i);
  EXPECT_FALSE(RE2::PartialMatchN("three", "(\\d+)", args, 1));

  // Multi-arg
  string s;
  argv[1] = &s;
  EXPECT_TRUE(RE2::PartialMatchN("answer: 42:life", "(\\d+):(\\w+)", args, 2));
  EXPECT_EQ(42, i);
  EXPECT_EQ("life", s);
  EXPECT_FALSE(RE2::PartialMatchN("hi1", "(\\w+)(1)", args, 2));
}